

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::SampledFunc::checkArguments
          (SampledFunc *this,ASTContext *context,Args *args,SourceRange range,Expression *param_5)

{
  bool bVar1;
  Compilation *this_00;
  Type *pTVar2;
  ASTContext *in_RCX;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RDX;
  Expression *in_R8;
  ASTContext *unaff_retaddr;
  SystemSubroutine *in_stack_00000008;
  undefined1 in_stack_00000010 [16];
  size_t in_stack_00000030;
  Compilation *comp;
  undefined8 in_stack_fffffffffffffff8;
  undefined1 isMethod;
  
  isMethod = (undefined1)((ulong)in_stack_fffffffffffffff8 >> 0x38);
  this_00 = ASTContext::getCompilation((ASTContext *)0xb03d36);
  bVar1 = SystemSubroutine::checkArgCount
                    (in_stack_00000008,unaff_retaddr,(bool)isMethod,(Args *)in_R8,
                     (SourceRange)in_stack_00000010,in_stack_00000030,(size_t)comp);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
    AssertionExpr::checkSampledValueExpr
              (in_R8,in_RCX,false,SUB84((ulong)this_00 >> 0x20,0),SUB84(this_00,0));
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
    pTVar2 = not_null<const_slang::ast::Type_*>::operator*
                       ((not_null<const_slang::ast::Type_*> *)0xb03de9);
  }
  else {
    pTVar2 = Compilation::getErrorType(this_00);
  }
  return pTVar2;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, 1))
            return comp.getErrorType();

        AssertionExpr::checkSampledValueExpr(*args[0], context, false, diag::SampledValueLocalVar,
                                             diag::SampledValueMatched);

        return *args[0]->type;
    }